

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleDisplayNamesImpl::LocaleDisplayNamesImpl
          (LocaleDisplayNamesImpl *this,Locale *locale,UDialectHandling dialectHandling)

{
  UDialectHandling dialectHandling_local;
  Locale *locale_local;
  LocaleDisplayNamesImpl *this_local;
  
  LocaleDisplayNames::LocaleDisplayNames(&this->super_LocaleDisplayNames);
  (this->super_LocaleDisplayNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleDisplayNamesImpl_004a1b98;
  Locale::Locale(&this->locale);
  this->dialectHandling = dialectHandling;
  ICUDataTable::ICUDataTable(&this->langData,"icudt63l-lang",locale);
  ICUDataTable::ICUDataTable(&this->regionData,"icudt63l-region",locale);
  SimpleFormatter::SimpleFormatter(&this->separatorFormat);
  SimpleFormatter::SimpleFormatter(&this->format);
  SimpleFormatter::SimpleFormatter(&this->keyTypeFormat);
  this->capitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  UnicodeString::UnicodeString(&this->formatOpenParen);
  UnicodeString::UnicodeString(&this->formatReplaceOpenParen);
  UnicodeString::UnicodeString(&this->formatCloseParen);
  UnicodeString::UnicodeString(&this->formatReplaceCloseParen);
  this->nameLength = UDISPCTX_LENGTH_FULL;
  initialize(this);
  return;
}

Assistant:

LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(const Locale& locale,
                                               UDialectHandling dialectHandling)
    : dialectHandling(dialectHandling)
    , langData(U_ICUDATA_LANG, locale)
    , regionData(U_ICUDATA_REGION, locale)
    , capitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
    , capitalizationBrkIter(NULL)
    , nameLength(UDISPCTX_LENGTH_FULL)
{
    initialize();
}